

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::finalizeTable(TranslateToFuzzReader *this)

{
  Module *wasm;
  anon_class_16_2_f8897cbb visitor;
  bool bVar1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *this_00;
  reference this_01;
  pointer pTVar2;
  Address *pAVar3;
  address64_t aVar4;
  Name *pNVar5;
  Name local_70;
  Address local_60;
  Address local_58;
  Address ReasonableMaxTableSize;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range1;
  TranslateToFuzzReader *this_local;
  
  this_00 = &this->wasm->tables;
  __end1 = std::
           vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ::begin(this_00);
  table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
          std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                *)&table);
    if (!bVar1) {
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
              ::operator*(&__end1);
    wasm = this->wasm;
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
    visitor.table = this_01;
    visitor.this = this;
    ReasonableMaxTableSize.addr = (address64_t)this;
    ModuleUtils::iterTableSegments<wasm::TranslateToFuzzReader::finalizeTable()::__0>
              (wasm,(Name)(pTVar2->super_Importable).super_Named.name.super_IString.str,visitor);
    Address::Address(&local_58,10000);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
    pAVar3 = std::min<wasm::Address>(&pTVar2->initial,&local_58);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
    (pTVar2->initial).addr = pAVar3->addr;
    aVar4 = Address::operator_cast_to_unsigned_long(&local_58);
    if (0xffffffff < aVar4) break;
    bVar1 = oneIn(this,2);
    if (bVar1) {
      Address::Address(&local_60,0xffffffff);
    }
    else {
      pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
      local_60.addr = (pTVar2->initial).addr;
    }
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
    (pTVar2->max).addr = local_60.addr;
    if ((this->preserveImportsAndExports & 1U) == 0) {
      Name::Name(&local_70);
      pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
      pNVar5 = Name::operator=(&(pTVar2->super_Importable).base,&local_70);
      pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_01);
      Name::operator=(&(pTVar2->super_Importable).module,pNVar5);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("ReasonableMaxTableSize <= Table::kMaxSize",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x346,"void wasm::TranslateToFuzzReader::finalizeTable()");
}

Assistant:

void TranslateToFuzzReader::finalizeTable() {
  for (auto& table : wasm.tables) {
    ModuleUtils::iterTableSegments(
      wasm, table->name, [&](ElementSegment* segment) {
        // If the offset contains a global that was imported (which is ok) but
        // no longer is (not ok unless GC is enabled), we may need to change
        // that.
        if (!wasm.features.hasGC()) {
          for ([[maybe_unused]] auto* get :
               FindAll<GlobalGet>(segment->offset).list) {
            // No imported globals should remain.
            assert(!wasm.getGlobal(get->name)->imported());
            // TODO: the segments must not overlap...
            segment->offset =
              builder.makeConst(Literal::makeFromInt32(0, table->addressType));
          }
        }
        Address maxOffset = segment->data.size();
        if (auto* offset = segment->offset->dynCast<Const>()) {
          maxOffset = maxOffset + offset->value.getInteger();
        }
        table->initial = std::max(table->initial, maxOffset);
      });

    // The code above raises table->initial to a size large enough to accomodate
    // all of its segments, with the intention of avoiding a trap during
    // startup. However a single segment of (say) size 4GB would have a table of
    // that size, which will use a lot of memory and execute very slowly, so we
    // prefer in the fuzzer to trap on such a thing. To achieve that, set a
    // reasonable limit for the maximum table size.
    //
    // This also avoids an issue that arises from table->initial being an
    // Address (64 bits) but Table::kMaxSize being an Index (32 bits), as a
    // result of which we need to clamp to Table::kMaxSize as well in order for
    // the module to validate (but since we are clamping to a smaller value,
    // there is no need).
    const Address ReasonableMaxTableSize = 10000;
    table->initial = std::min(table->initial, ReasonableMaxTableSize);
    assert(ReasonableMaxTableSize <= Table::kMaxSize);

    table->max = oneIn(2) ? Address(Table::kUnlimitedSize) : table->initial;

    if (!preserveImportsAndExports) {
      // Avoid an imported table (which the fuzz harness would need to handle).
      table->module = table->base = Name();
    }
  }
}